

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O0

size_t duckdb_zstd::FSE_NCountWriteBound(uint maxSymbolValue,uint tableLog)

{
  undefined8 local_18;
  size_t maxHeaderSize;
  uint tableLog_local;
  uint maxSymbolValue_local;
  
  local_18 = (ulong)(((maxSymbolValue + 1) * tableLog + 6 >> 3) + 3);
  if (maxSymbolValue == 0) {
    local_18 = 0x200;
  }
  return local_18;
}

Assistant:

size_t FSE_NCountWriteBound(unsigned maxSymbolValue, unsigned tableLog)
{
    size_t const maxHeaderSize = (((maxSymbolValue+1) * tableLog
                                   + 4 /* bitCount initialized at 4 */
                                   + 2 /* first two symbols may use one additional bit each */) / 8)
                                   + 1 /* round up to whole nb bytes */
                                   + 2 /* additional two bytes for bitstream flush */;
    return maxSymbolValue ? maxHeaderSize : FSE_NCOUNTBOUND;  /* maxSymbolValue==0 ? use default */
}